

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFromIntoUninitializedExtension
          (ExtensionSet *this,Extension *dst_extension,MessageLite *extendee,int number,
          Extension *other_extension,Arena *other_arena)

{
  byte bVar1;
  MessageLite *this_00;
  undefined4 uVar2;
  undefined4 uVar3;
  FieldType FVar4;
  bool bVar5;
  undefined1 uVar6;
  bool bVar7;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar8;
  undefined4 extraout_var;
  RepeatedPtrFieldBase *pRVar9;
  void *pvVar10;
  string *psVar11;
  long *unaff_R15;
  Arena *pAVar12;
  Arena *local_28 [2];
  
  dst_extension->descriptor = other_extension->descriptor;
  uVar2 = *(undefined4 *)((long)&other_extension->field_0 + 4);
  FVar4 = other_extension->type;
  bVar5 = other_extension->is_repeated;
  uVar6 = other_extension->field_0xa;
  bVar7 = other_extension->is_packed;
  uVar3 = *(undefined4 *)(other_extension->cached_size).int_;
  (dst_extension->field_0).int32_t_value = (other_extension->field_0).int32_t_value;
  *(undefined4 *)((long)&dst_extension->field_0 + 4) = uVar2;
  dst_extension->type = FVar4;
  dst_extension->is_repeated = bVar5;
  dst_extension->field_0xa = uVar6;
  dst_extension->is_packed = bVar7;
  *(undefined4 *)(dst_extension->cached_size).int_ = uVar3;
  bVar1 = other_extension->type;
  if (other_extension->is_repeated != true) {
    if ((byte)(bVar1 - 0x13) < 0xee) goto LAB_00f87151;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
      this_00 = (MessageLite *)(other_extension->field_0).int64_t_value;
      if ((other_extension->field_0xa & 4) != 0) {
        aVar8._0_4_ = (*this_00->_vptr_MessageLite[2])(this_00,this->arena_,this_00,other_arena);
        aVar8.int64_t_value._4_4_ = extraout_var;
        dst_extension->field_0 = aVar8;
        return;
      }
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)MessageLite::New(this_00,this->arena_);
      dst_extension->field_0 = aVar8;
      MessageLite::CheckTypeAndMergeFrom
                ((MessageLite *)aVar8,(MessageLite *)other_extension->field_0);
      return;
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 9) {
      return;
    }
    unaff_R15 = *(long **)&(other_extension->field_0).int32_t_value;
    if (&this->arena_->impl_ != (ThreadSafeArena *)0x0) {
      psVar11 = (string *)ThreadSafeArena::AllocateFromStringBlock(&this->arena_->impl_);
      *(string **)psVar11 = psVar11 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar11,*unaff_R15,unaff_R15[1] + *unaff_R15);
      goto LAB_00f86ece;
    }
LAB_00f87159:
    psVar11 = (string *)operator_new(0x20);
    *(string **)psVar11 = psVar11 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar11,*unaff_R15,unaff_R15[1] + *unaff_R15);
LAB_00f86ece:
    *(string **)&(dst_extension->field_0).int32_t_value = psVar11;
    return;
  }
  if ((byte)(bVar1 - 0x13) < 0xee) {
    InternalExtensionMergeFromIntoUninitializedExtension((ExtensionSet *)local_28);
LAB_00f87151:
    InternalExtensionMergeFromIntoUninitializedExtension((ExtensionSet *)local_28);
    goto LAB_00f87159;
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  case 1:
    pAVar12 = this->arena_;
    if (pAVar12 == (Arena *)0x0) {
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)operator_new(0x10);
      RepeatedField<int>::RepeatedField((RepeatedField<int> *)aVar8,(Arena *)0x0);
    }
    else {
LAB_00f8701d:
      pvVar10 = Arena::Allocate(pAVar12,0x10);
      local_28[0] = pAVar12;
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
              Construct<google::protobuf::Arena*>(pvVar10,local_28);
    }
    goto LAB_00f8703b;
  case 2:
    pAVar12 = this->arena_;
    if (pAVar12 == (Arena *)0x0) {
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)operator_new(0x10);
      RepeatedField<long>::RepeatedField((RepeatedField<long> *)aVar8,(Arena *)0x0);
    }
    else {
      pvVar10 = Arena::Allocate(pAVar12,0x10);
      local_28[0] = pAVar12;
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::InternalHelper<google::protobuf::RepeatedField<long>>::
              Construct<google::protobuf::Arena*>(pvVar10,local_28);
    }
    dst_extension->field_0 = aVar8;
    RepeatedField<long>::MergeFrom
              ((RepeatedField<long> *)aVar8,(RepeatedField<long> *)other_extension->field_0);
    break;
  case 3:
    pAVar12 = this->arena_;
    if (pAVar12 == (Arena *)0x0) {
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)operator_new(0x10);
      RepeatedField<unsigned_int>::RepeatedField((RepeatedField<unsigned_int> *)aVar8,(Arena *)0x0);
    }
    else {
      pvVar10 = Arena::Allocate(pAVar12,0x10);
      local_28[0] = pAVar12;
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_int>>::
              Construct<google::protobuf::Arena*>(pvVar10,local_28);
    }
    dst_extension->field_0 = aVar8;
    RepeatedField<unsigned_int>::MergeFrom
              ((RepeatedField<unsigned_int> *)aVar8,
               (RepeatedField<unsigned_int> *)other_extension->field_0);
    break;
  case 4:
    pAVar12 = this->arena_;
    if (pAVar12 == (Arena *)0x0) {
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)operator_new(0x10);
      RepeatedField<unsigned_long>::RepeatedField
                ((RepeatedField<unsigned_long> *)aVar8,(Arena *)0x0);
    }
    else {
      pvVar10 = Arena::Allocate(pAVar12,0x10);
      local_28[0] = pAVar12;
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
              Construct<google::protobuf::Arena*>(pvVar10,local_28);
    }
    dst_extension->field_0 = aVar8;
    RepeatedField<unsigned_long>::MergeFrom
              ((RepeatedField<unsigned_long> *)aVar8,
               (RepeatedField<unsigned_long> *)other_extension->field_0);
    break;
  case 5:
    pAVar12 = this->arena_;
    if (pAVar12 == (Arena *)0x0) {
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)operator_new(0x10);
      RepeatedField<double>::RepeatedField((RepeatedField<double> *)aVar8,(Arena *)0x0);
    }
    else {
      pvVar10 = Arena::Allocate(pAVar12,0x10);
      local_28[0] = pAVar12;
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::InternalHelper<google::protobuf::RepeatedField<double>>::
              Construct<google::protobuf::Arena*>(pvVar10,local_28);
    }
    dst_extension->field_0 = aVar8;
    RepeatedField<double>::MergeFrom
              ((RepeatedField<double> *)aVar8,(RepeatedField<double> *)other_extension->field_0);
    break;
  case 6:
    pAVar12 = this->arena_;
    if (pAVar12 == (Arena *)0x0) {
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)operator_new(0x10);
      RepeatedField<float>::RepeatedField((RepeatedField<float> *)aVar8,(Arena *)0x0);
    }
    else {
      pvVar10 = Arena::Allocate(pAVar12,0x10);
      local_28[0] = pAVar12;
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::InternalHelper<google::protobuf::RepeatedField<float>>::
              Construct<google::protobuf::Arena*>(pvVar10,local_28);
    }
    dst_extension->field_0 = aVar8;
    RepeatedField<float>::MergeFrom
              ((RepeatedField<float> *)aVar8,(RepeatedField<float> *)other_extension->field_0);
    break;
  case 7:
    pAVar12 = this->arena_;
    if (pAVar12 == (Arena *)0x0) {
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)operator_new(0x10);
      RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)aVar8,(Arena *)0x0);
    }
    else {
      pvVar10 = Arena::Allocate(pAVar12,0x10);
      local_28[0] = pAVar12;
      aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::InternalHelper<google::protobuf::RepeatedField<bool>>::
              Construct<google::protobuf::Arena*>(pvVar10,local_28);
    }
    dst_extension->field_0 = aVar8;
    RepeatedField<bool>::MergeFrom
              ((RepeatedField<bool> *)aVar8,(RepeatedField<bool> *)other_extension->field_0);
    break;
  case 8:
    pAVar12 = this->arena_;
    if (pAVar12 != (Arena *)0x0) goto LAB_00f8701d;
    aVar8 = (anon_union_8_9_fdc4a54a_for_Extension_0)operator_new(0x10);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)aVar8,(Arena *)0x0);
LAB_00f8703b:
    dst_extension->field_0 = aVar8;
    RepeatedField<int>::MergeFrom
              ((RepeatedField<int> *)aVar8,(RepeatedField<int> *)other_extension->field_0);
    break;
  case 9:
    pAVar12 = this->arena_;
    if (pAVar12 == (Arena *)0x0) {
      pRVar9 = (RepeatedPtrFieldBase *)operator_new(0x18);
      pRVar9->tagged_rep_or_elem_ = (void *)0x0;
      pRVar9->current_size_ = 0;
      pRVar9->capacity_proxy_ = 0;
      pRVar9->arena_ = (Arena *)0x0;
    }
    else {
      pRVar9 = (RepeatedPtrFieldBase *)Arena::Allocate(pAVar12,0x18);
      pRVar9->tagged_rep_or_elem_ = (void *)0x0;
      pRVar9->current_size_ = 0;
      pRVar9->capacity_proxy_ = 0;
      pRVar9->arena_ = pAVar12;
    }
    (dst_extension->field_0).int64_t_value = (int64_t)pRVar9;
    if (((RepeatedPtrFieldBase *)(other_extension->field_0).int64_t_value)->current_size_ != 0) {
      RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
                (pRVar9,(RepeatedPtrFieldBase *)(other_extension->field_0).int64_t_value);
      return;
    }
    break;
  case 10:
    pAVar12 = this->arena_;
    if (pAVar12 == (Arena *)0x0) {
      pRVar9 = (RepeatedPtrFieldBase *)operator_new(0x18);
      pRVar9->tagged_rep_or_elem_ = (void *)0x0;
      pRVar9->current_size_ = 0;
      pRVar9->capacity_proxy_ = 0;
      pRVar9->arena_ = (Arena *)0x0;
    }
    else {
      pRVar9 = (RepeatedPtrFieldBase *)Arena::Allocate(pAVar12,0x18);
      pRVar9->tagged_rep_or_elem_ = (void *)0x0;
      pRVar9->current_size_ = 0;
      pRVar9->capacity_proxy_ = 0;
      pRVar9->arena_ = pAVar12;
    }
    (dst_extension->field_0).int64_t_value = (int64_t)pRVar9;
    if (((RepeatedPtrFieldBase *)(other_extension->field_0).int64_t_value)->current_size_ != 0) {
      RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
                (pRVar9,(RepeatedPtrFieldBase *)(other_extension->field_0).int64_t_value);
      return;
    }
  }
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFromIntoUninitializedExtension(
    Extension& dst_extension, const MessageLite* extendee, int number,
    const Extension& other_extension, Arena* other_arena) {
  // Copy and initialize all the fields.
  // We fix up incorrect pointers later.
  // Primitive values are copied here.
  dst_extension = other_extension;

  if (other_extension.is_repeated) {
    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE)       \
  case WireFormatLite::CPPTYPE_##UPPERCASE:                    \
    dst_extension.ptr.repeated_##LOWERCASE##_value =           \
        Arena::Create<REPEATED_TYPE>(arena_);                  \
    dst_extension.ptr.repeated_##LOWERCASE##_value->MergeFrom( \
        *other_extension.ptr.repeated_##LOWERCASE##_value);    \
    break;

      HANDLE_TYPE(INT32, int32_t, RepeatedField<int32_t>);
      HANDLE_TYPE(INT64, int64_t, RepeatedField<int64_t>);
      HANDLE_TYPE(UINT32, uint32_t, RepeatedField<uint32_t>);
      HANDLE_TYPE(UINT64, uint64_t, RepeatedField<uint64_t>);
      HANDLE_TYPE(FLOAT, float, RepeatedField<float>);
      HANDLE_TYPE(DOUBLE, double, RepeatedField<double>);
      HANDLE_TYPE(BOOL, bool, RepeatedField<bool>);
      HANDLE_TYPE(ENUM, enum, RepeatedField<int>);
      HANDLE_TYPE(STRING, string, RepeatedPtrField<std::string>);
      HANDLE_TYPE(MESSAGE, message, RepeatedPtrField<MessageLite>);
#undef HANDLE_TYPE
    }
    return;
  }

  // Non-repeated extension
  switch (cpp_type(other_extension.type)) {
    case WireFormatLite::CPPTYPE_INT32:
    case WireFormatLite::CPPTYPE_INT64:
    case WireFormatLite::CPPTYPE_UINT32:
    case WireFormatLite::CPPTYPE_UINT64:
    case WireFormatLite::CPPTYPE_FLOAT:
    case WireFormatLite::CPPTYPE_DOUBLE:
    case WireFormatLite::CPPTYPE_BOOL:
    case WireFormatLite::CPPTYPE_ENUM:
      break;  // Do nothing.
    case WireFormatLite::CPPTYPE_STRING:
      dst_extension.ptr.string_value =
          Arena::Create<std::string>(arena_, *other_extension.ptr.string_value);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE: {
      if (other_extension.is_lazy) {
        dst_extension.ptr.lazymessage_value =
            other_extension.ptr.lazymessage_value->Clone(
                arena_, *other_extension.ptr.lazymessage_value, other_arena);
      } else {
        dst_extension.ptr.message_value =
            other_extension.ptr.message_value->New(arena_);
        dst_extension.ptr.message_value->CheckTypeAndMergeFrom(
            *other_extension.ptr.message_value);
      }
      break;
    }
  }
}